

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_handle_possible_reconnect(mbedtls_ssl_context *ssl)

{
  size_t local_28;
  size_t len;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmStack_18 = ssl;
  len._4_4_ = ssl_check_dtls_clihlo_cookie
                        (ssl->conf->f_cookie_write,ssl->conf->f_cookie_check,ssl->conf->p_cookie,
                         ssl->cli_id,ssl->cli_id_len,ssl->in_buf,ssl->in_left,ssl->out_buf,0x4000,
                         &local_28);
  mbedtls_debug_print_ret
            (pmStack_18,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xd63,"ssl_check_dtls_clihlo_cookie",len._4_4_);
  if (len._4_4_ == -0x6a80) {
    (*pmStack_18->f_send)(pmStack_18->p_bio,pmStack_18->out_buf,local_28);
    ssl_local._4_4_ = -0x6a80;
  }
  else if (len._4_4_ == 0) {
    len._4_4_ = ssl_session_reset_int(pmStack_18,1);
    if (len._4_4_ == 0) {
      ssl_local._4_4_ = -0x6780;
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xd74,"reset",len._4_4_);
      ssl_local._4_4_ = len._4_4_;
    }
  }
  else {
    ssl_local._4_4_ = len._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_handle_possible_reconnect( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t len;

    ret = ssl_check_dtls_clihlo_cookie(
            ssl->conf->f_cookie_write,
            ssl->conf->f_cookie_check,
            ssl->conf->p_cookie,
            ssl->cli_id, ssl->cli_id_len,
            ssl->in_buf, ssl->in_left,
            ssl->out_buf, MBEDTLS_SSL_MAX_CONTENT_LEN, &len );

    MBEDTLS_SSL_DEBUG_RET( 2, "ssl_check_dtls_clihlo_cookie", ret );

    if( ret == MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED )
    {
        /* Don't check write errors as we can't do anything here.
         * If the error is permanent we'll catch it later,
         * if it's not, then hopefully it'll work next time. */
        (void) ssl->f_send( ssl->p_bio, ssl->out_buf, len );

        return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
    }

    if( ret == 0 )
    {
        /* Got a valid cookie, partially reset context */
        if( ( ret = ssl_session_reset_int( ssl, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "reset", ret );
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_CLIENT_RECONNECT );
    }

    return( ret );
}